

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

unsigned_long llvm::reverseBits<unsigned_long>(unsigned_long Val)

{
  uint local_24;
  unsigned_long uStack_20;
  uint i;
  uchar out [8];
  uchar in [8];
  unsigned_long Val_local;
  
  out = (uchar  [8])Val;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    out[-1 - (ulong)local_24] = BitReverseTable256[out[local_24]];
  }
  return uStack_20;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}